

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O0

void __thiscall
denialofservice_tests::block_relay_only_eviction::test_method(block_relay_only_eviction *this)

{
  CNode *pCVar1;
  duration<long,_std::ratio<1L,_1L>_> __i;
  Options opts;
  bool bVar2;
  Options *pOVar3;
  pointer pPVar4;
  reference ppCVar5;
  long in_FS_OFFSET;
  CNode *node;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int64_t MINIMUM_CONNECT_TIME;
  int max_outbound_block_relay;
  iterator __end1;
  iterator __begin1;
  vector<CNode_*,_std::allocator<CNode_*>_> vNodes;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> peerLogic;
  __single_object connman;
  NodeId id;
  Options options;
  lazy_ostream *prev;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *in_stack_fffffffffffff918;
  assertion_result *this_00;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff924;
  CTxMemPool *in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  lazy_ostream *in_stack_fffffffffffff938;
  CConnman *in_stack_fffffffffffff940;
  const_string *file;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  AddrMan *in_stack_fffffffffffff950;
  BanMan *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  Options *in_stack_fffffffffffff970;
  CConnman *in_stack_fffffffffffff978;
  undefined7 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff987;
  uint32_t in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff9a8;
  ConnmanTestMsg *in_stack_fffffffffffff9b0;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  vector<CNode_*,_std::allocator<CNode_*>_> *in_stack_fffffffffffff9c0;
  NodeId *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  int local_57c;
  int local_568;
  int local_564;
  int iVar7;
  const_string local_528 [2];
  lazy_ostream local_508 [2];
  assertion_result local_4e8 [2];
  const_string local_4b0 [2];
  lazy_ostream local_490 [2];
  assertion_result local_470 [2];
  const_string local_438 [2];
  lazy_ostream local_418 [2];
  assertion_result local_3f8 [2];
  const_string local_3c0 [2];
  lazy_ostream local_3a0 [2];
  assertion_result local_380 [2];
  const_string local_348 [2];
  lazy_ostream local_328 [2];
  assertion_result local_308 [2];
  const_string local_2d0 [2];
  lazy_ostream local_2b0 [2];
  assertion_result local_290 [2];
  const_string local_258 [2];
  lazy_ostream local_238 [2];
  assertion_result local_218 [2];
  const_string local_1e0 [2];
  lazy_ostream local_1c0 [2];
  assertion_result local_1a0 [3];
  undefined1 local_150;
  undefined1 uStack_14f;
  ushort uStack_14e;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined2 uStack_142;
  undefined4 local_140;
  undefined4 local_130;
  undefined4 local_12c;
  undefined8 local_120;
  undefined4 local_110;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_120 = 0;
  local_12c = 0x1337;
  local_130 = 0x1337;
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*(in_stack_fffffffffffff918);
  std::unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>::operator*
            ((unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> *)
             in_stack_fffffffffffff918);
  Params();
  std::make_unique<ConnmanTestMsg,int,int,AddrMan&,NetGroupManager_const&,CChainParams_const&>
            ((int *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
             (int *)in_stack_fffffffffffff958,in_stack_fffffffffffff950,
             (NetGroupManager *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (CChainParams *)in_stack_fffffffffffff940);
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator*
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)
             in_stack_fffffffffffff918);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*(in_stack_fffffffffffff918);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff918);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffff918);
  pOVar3 = (Options *)
           std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator*
                     ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                      in_stack_fffffffffffff918);
  local_150 = 0;
  uStack_14f = 0;
  uStack_14c = 100;
  uStack_148 = 100;
  uStack_144 = 0;
  uStack_143 = 0;
  local_140 = 2000;
  uVar6 = 2000;
  prev = (lazy_ostream *)CONCAT44(100,(uint)uStack_14e << 0x10);
  this_00 = (assertion_result *)CONCAT26(uStack_142,100);
  opts.max_extra_txs = (int)in_stack_fffffffffffff980;
  opts.capture_messages = (bool)(char)((uint7)in_stack_fffffffffffff980 >> 0x20);
  opts.deterministic_rng = (bool)(char)((uint7)in_stack_fffffffffffff980 >> 0x28);
  opts._14_1_ = (char)((uint7)in_stack_fffffffffffff980 >> 0x30);
  opts._0_8_ = in_stack_fffffffffffff978;
  opts._15_1_ = in_stack_fffffffffffff987;
  opts.max_headers_result = in_stack_fffffffffffff988;
  PeerManager::make(in_stack_fffffffffffff940,(AddrMan *)in_stack_fffffffffffff938,
                    in_stack_fffffffffffff958,
                    (ChainstateManager *)
                    CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                    in_stack_fffffffffffff928,(Warnings *)in_stack_fffffffffffff970,opts);
  CConnman::Options::Options(pOVar3);
  local_110 = 0x7d;
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator->
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)pOVar3);
  CConnman::Init(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)pOVar3);
  for (iVar7 = 0; iVar7 < 2; iVar7 = iVar7 + 1) {
    std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator*
              ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator*
              ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)this_00);
    pOVar3 = (Options *)((ulong)pOVar3 & 0xffffffff00000000);
    OutboundTest::AddRandomOutboundPeer
              ((OutboundTest *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
               (PeerManager *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
               in_stack_fffffffffffff9b0,(ConnectionType)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff9a8 >> 0x18,0));
  }
  pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pOVar3);
  (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x14])();
  for (iVar7 = 0; iVar7 < 2; iVar7 = iVar7 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pOVar3);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (const_string *)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                 (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
      std::vector<CNode_*,_std::allocator<CNode_*>_>::operator[]
                ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00,(size_type)prev);
      std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
      boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      pOVar3 = (Options *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1a0,local_1c0,local_1e0,0x105,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pOVar3);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator*
            ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator*
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)this_00);
  pOVar3 = (Options *)((ulong)pOVar3 & 0xffffffff00000000);
  OutboundTest::AddRandomOutboundPeer
            ((OutboundTest *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
             in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
             (PeerManager *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
             in_stack_fffffffffffff9b0,(ConnectionType)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff9a8 >> 0x18,0));
  pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pOVar3);
  (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x14])();
  for (local_564 = 0; local_564 < 2; local_564 = local_564 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pOVar3);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (const_string *)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                 (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
      std::vector<CNode_*,_std::allocator<CNode_*>_>::operator[]
                ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00,(size_type)prev);
      std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
      boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      pOVar3 = (Options *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_218,local_238,local_258,0x10e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pOVar3);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pOVar3);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (const_string *)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
               (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::vector<CNode_*,_std::allocator<CNode_*>_>::back
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)pOVar3);
    std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
    boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    pOVar3 = (Options *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_290,local_2b0,local_2d0,0x110,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pOVar3);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  GetTime();
  SetMockTime((int64_t)pOVar3);
  pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pOVar3);
  (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x14])();
  for (local_568 = 0; local_568 < 2; local_568 = local_568 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pOVar3);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (const_string *)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                 (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
      std::vector<CNode_*,_std::allocator<CNode_*>_>::operator[]
                ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00,(size_type)prev);
      std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
      boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      pOVar3 = (Options *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_308,local_328,local_348,0x115,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pOVar3);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pOVar3);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (const_string *)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
               (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::vector<CNode_*,_std::allocator<CNode_*>_>::back
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)pOVar3);
    std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
    boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    pOVar3 = (Options *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_380,local_3a0,local_3c0,0x117,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pOVar3);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::back
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)pOVar3);
  std::atomic<bool>::operator=((atomic<bool> *)pOVar3,false);
  GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  std::vector<CNode_*,_std::allocator<CNode_*>_>::back
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)pOVar3);
  __i.__r._4_4_ = in_stack_fffffffffffff924;
  __i.__r._0_4_ = uVar6;
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::operator=
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)prev,__i);
  pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pOVar3);
  (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x14])();
  for (local_57c = 0; local_57c < 1; local_57c = local_57c + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pOVar3);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                 (const_string *)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
                 (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
      std::vector<CNode_*,_std::allocator<CNode_*>_>::operator[]
                ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00,(size_type)prev);
      std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
      boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
      pOVar3 = (Options *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3f8,local_418,local_438,0x120,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pOVar3);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pOVar3);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
               (const_string *)in_stack_fffffffffffff940,(size_t)in_stack_fffffffffffff938,
               (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::vector<CNode_*,_std::allocator<CNode_*>_>::operator[]
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00,(size_type)prev);
    std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
    boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    pOVar3 = (Options *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_470,local_490,local_4b0,0x122,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pOVar3);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
    in_stack_fffffffffffff94f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff94f);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pOVar3);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),file
               ,(size_t)in_stack_fffffffffffff938,
               (const_string *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    std::vector<CNode_*,_std::allocator<CNode_*>_>::back
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)pOVar3);
    std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_fffffffffffff924,uVar6));
    boost::test_tools::assertion_result::assertion_result(this_00,SUB81((ulong)prev >> 0x38,0));
    in_stack_fffffffffffff938 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pOVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,(pointer)prev,(unsigned_long)pOVar3);
    pOVar3 = (Options *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4e8,local_508,local_528,0x123,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pOVar3);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pOVar3);
    in_stack_fffffffffffff937 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff937);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)prev);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)prev);
  while (bVar2 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)this_00,
                            (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)prev), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppCVar5 = __gnu_cxx::
              __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         *)pOVar3);
    pCVar1 = *ppCVar5;
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pOVar3);
    (*(pPVar4->super_NetEventsInterface)._vptr_NetEventsInterface[1])
              (&pPVar4->super_NetEventsInterface,pCVar1);
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               pOVar3);
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator->
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)pOVar3);
  ConnmanTestMsg::ClearTestNodes((ConnmanTestMsg *)in_stack_fffffffffffff928);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::~vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00);
  CConnman::Options::~Options(pOVar3);
  std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::~unique_ptr
            ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(block_relay_only_eviction, OutboundTest)
{
    NodeId id{0};
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    constexpr int max_outbound_block_relay{MAX_BLOCK_RELAY_ONLY_CONNECTIONS};
    constexpr int64_t MINIMUM_CONNECT_TIME{30};
    CConnman::Options options;
    options.m_max_automatic_connections = DEFAULT_MAX_PEER_CONNECTIONS;

    connman->Init(options);
    std::vector<CNode*> vNodes;

    // Add block-relay-only peers up to the limit
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::BLOCK_RELAY);
    }
    peerLogic->CheckForStaleTipAndEvictPeers();

    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }

    // Add an extra block-relay-only peer breaking the limit (mocks logic in ThreadOpenConnections)
    AddRandomOutboundPeer(id, vNodes, *peerLogic, *connman, ConnectionType::BLOCK_RELAY);
    peerLogic->CheckForStaleTipAndEvictPeers();

    // The extra peer should only get marked for eviction after MINIMUM_CONNECT_TIME
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes.back()->fDisconnect == false);

    SetMockTime(GetTime() + MINIMUM_CONNECT_TIME + 1);
    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_block_relay; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes.back()->fDisconnect == true);

    // Update the last block time for the extra peer,
    // and check that the next youngest peer gets evicted.
    vNodes.back()->fDisconnect = false;
    vNodes.back()->m_last_block_time = GetTime<std::chrono::seconds>();

    peerLogic->CheckForStaleTipAndEvictPeers();
    for (int i = 0; i < max_outbound_block_relay - 1; ++i) {
        BOOST_CHECK(vNodes[i]->fDisconnect == false);
    }
    BOOST_CHECK(vNodes[max_outbound_block_relay - 1]->fDisconnect == true);
    BOOST_CHECK(vNodes.back()->fDisconnect == false);

    for (const CNode* node : vNodes) {
        peerLogic->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}